

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O0

adiak_datatype_t *
adiak::internal::
parse<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
::make_type(void)

{
  adiak_numerical_t aVar1;
  adiak_datatype_t *__s;
  adiak_datatype_t **ppaVar2;
  size_t N;
  adiak_datatype_t *datatype;
  
  __s = (adiak_datatype_t *)malloc(0x20);
  memset(__s,0,0x20);
  __s->dtype = adiak_tuple;
  aVar1 = adiak_numerical_from_type(__s->dtype);
  __s->numerical = aVar1;
  __s->num_elements = 2;
  __s->num_subtypes = 2;
  ppaVar2 = (adiak_datatype_t **)malloc(0x10);
  __s->subtype = ppaVar2;
  set_tuple_type<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_2UL>
  ::settype(__s->subtype);
  return __s;
}

Assistant:

static adiak_datatype_t *make_type() {
            adiak_datatype_t *datatype = (adiak_datatype_t *) malloc(sizeof(adiak_datatype_t));
            const size_t N = std::tuple_size<std::tuple<Ts...> >::value;
            memset(datatype, 0, sizeof(*datatype));
            datatype->dtype = adiak_tuple;
            datatype->numerical = adiak_numerical_from_type(datatype->dtype);
            datatype->num_elements = N;
            datatype->num_subtypes = N;
            datatype->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *) * N);
            set_tuple_type<std::tuple<Ts...>, N>::settype(datatype->subtype);
            return datatype;            
         }